

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O0

void __thiscall
Shell::NewCNF::introduceGenClause
          (NewCNF *this,GenLit gl0,GenLit gl1,BindingList *bindings,BindingList *foolBindings)

{
  List<std::pair<Kernel::Formula_*,_bool>_> *this_00;
  List<std::pair<Kernel::Formula_*,_bool>_> *this_01;
  undefined8 in_RCX;
  undefined1 in_DL;
  undefined8 in_RSI;
  undefined1 in_R8B;
  pair<Kernel::Formula_*,_bool> head;
  pair<Kernel::Formula_*,_bool> head_00;
  List<std::pair<Kernel::Formula_*,_bool>_> *in_stack_00000088;
  undefined4 uStack_60;
  undefined4 uStack_40;
  undefined7 uStack_17;
  undefined7 uStack_7;
  
  this_00 = (List<std::pair<Kernel::Formula_*,_bool>_> *)
            Lib::List<std::pair<Kernel::Formula*,bool>>::operator_new(0xbe01d9);
  uStack_40 = (undefined4)CONCAT71(uStack_7,in_DL);
  this_01 = (List<std::pair<Kernel::Formula_*,_bool>_> *)
            Lib::List<std::pair<Kernel::Formula*,bool>>::operator_new(0xbe01f2);
  uStack_60 = (undefined4)CONCAT71(uStack_17,in_R8B);
  head._8_4_ = uStack_60;
  head.first = (Formula *)in_RCX;
  head._12_4_ = 0;
  Lib::List<std::pair<Kernel::Formula_*,_bool>_>::List(this_01,head);
  head_00._8_4_ = uStack_40;
  head_00.first = (Formula *)in_RSI;
  head_00._12_4_ = 0;
  Lib::List<std::pair<Kernel::Formula_*,_bool>_>::List(this_00,head_00,this_01);
  introduceGenClause((NewCNF *)foolBindings,in_stack_00000088,(BindingList *)gl0._8_8_,
                     (BindingList *)gl0.first);
  return;
}

Assistant:

void introduceGenClause(GenLit gl0, GenLit gl1, BindingList* bindings=BindingList::empty(), BindingList* foolBindings=BindingList::empty()) {
    introduceGenClause(new List<GenLit>(gl0, new List<GenLit>(gl1)), bindings, foolBindings);
  }